

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O0

bool __thiscall ithipublisher::CollectMetricFiles(ithipublisher *this)

{
  MetricFileHolder *pMVar1;
  int iVar2;
  DIR *__dirp;
  MetricFileHolder *pMVar3;
  value_type __s;
  iterator __first;
  iterator __last;
  size_type sVar4;
  reference pp_Var5;
  iterator __first_00;
  iterator __last_00;
  bool bVar6;
  ulong local_370;
  size_t i_1;
  size_t last_index;
  value_type local_350;
  MetricFileHolder *pmfh;
  size_t i;
  bool found_already;
  MetricFileHolder met_file;
  dirent *file_ent;
  DIR *dir_met;
  char local_218 [7];
  bool ret;
  char dir_met_name [512];
  ithipublisher *this_local;
  
  iVar2 = snprintf(local_218,0x200,"%s%sM%d%s",this->ithi_folder,"/",(ulong)(uint)this->metric_id,
                   "/");
  dir_met._7_1_ = 0 < iVar2;
  if (dir_met._7_1_) {
    __dirp = opendir(local_218);
    if (__dirp == (DIR *)0x0) {
      dir_met._7_1_ = false;
    }
    else {
      while( true ) {
        bVar6 = false;
        if (dir_met._7_1_) {
          met_file._260_8_ = readdir(__dirp);
          bVar6 = (dirent *)met_file._260_8_ != (dirent *)0x0;
        }
        if (!bVar6) break;
        bVar6 = ParseFileName((MetricFileHolder *)((long)&i + 4),(char *)(met_file._260_8_ + 0x13),
                              this->metric_id);
        if (bVar6) {
          i._3_1_ = 0;
          for (pmfh = (MetricFileHolder *)0x0; pMVar1 = pmfh,
              pMVar3 = (MetricFileHolder *)
                       std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::size
                                 (&this->file_list), pMVar1 < pMVar3;
              pmfh = (MetricFileHolder *)(pmfh->file_name + 1)) {
            pp_Var5 = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::
                      operator[](&this->file_list,(size_type)pmfh);
            if (((*pp_Var5)->year == met_file.file_name._248_4_) &&
               (pp_Var5 = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::
                          operator[](&this->file_list,(size_type)pmfh), iVar2 = met_file.year,
               (*pp_Var5)->month == met_file.file_name._252_4_)) {
              pp_Var5 = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::
                        operator[](&this->file_list,(size_type)pmfh);
              if ((*pp_Var5)->day <= iVar2) {
                pp_Var5 = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::
                          operator[](&this->file_list,(size_type)pmfh);
                memcpy(*pp_Var5,(void *)((long)&i + 4),0x10c);
              }
              i._3_1_ = 1;
              break;
            }
          }
          if ((i._3_1_ & 1) == 0) {
            __s = (value_type)operator_new(0x10c);
            memset(__s,0,0x10c);
            local_350 = __s;
            if (__s == (value_type)0x0) {
              dir_met._7_1_ = false;
            }
            else {
              memcpy(__s,(void *)((long)&i + 4),0x10c);
              std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::push_back
                        (&this->file_list,&local_350);
            }
          }
        }
      }
      closedir(__dirp);
      sVar4 = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::size
                        (&this->file_list);
      dir_met._7_1_ = sVar4 != 0;
    }
  }
  if (dir_met._7_1_ != false) {
    __first = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::begin
                        (&this->file_list);
    __last = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::end
                       (&this->file_list);
    std::
    sort<__gnu_cxx::__normal_iterator<_MetricFileHolder**,std::vector<_MetricFileHolder*,std::allocator<_MetricFileHolder*>>>,bool(*)(_MetricFileHolder*,_MetricFileHolder*)>
              ((__normal_iterator<_MetricFileHolder_**,_std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>_>
                )__first._M_current,
               (__normal_iterator<_MetricFileHolder_**,_std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>_>
                )__last._M_current,MetricFileIsEarlier);
    sVar4 = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::size
                      (&this->file_list);
    sVar4 = sVar4 - 1;
    pp_Var5 = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::operator[]
                        (&this->file_list,sVar4);
    this->last_year = (*pp_Var5)->year;
    pp_Var5 = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::operator[]
                        (&this->file_list,sVar4);
    this->last_month = (*pp_Var5)->month;
    pp_Var5 = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::operator[]
                        (&this->file_list,sVar4);
    this->last_day = (*pp_Var5)->day;
    pp_Var5 = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::operator[]
                        (&this->file_list,0);
    this->first_year = (*pp_Var5)->year;
    pp_Var5 = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::operator[]
                        (&this->file_list,0);
    this->first_month = (*pp_Var5)->month;
    this->nb_months =
         ((this->last_month + 1) - this->first_month) + (this->last_year - this->first_year) * 0xc;
    local_370 = 0;
    while( true ) {
      bVar6 = false;
      if (dir_met._7_1_ != false) {
        sVar4 = std::vector<_MetricFileHolder_*,_std::allocator<_MetricFileHolder_*>_>::size
                          (&this->file_list);
        bVar6 = local_370 < sVar4;
      }
      if (!bVar6) break;
      dir_met._7_1_ = LoadFileData(this,(int)local_370,local_218);
      local_370 = local_370 + 1;
    }
    if (dir_met._7_1_ != false) {
      __first_00 = std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>::begin
                             (&this->line_list);
      __last_00 = std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>::end
                            (&this->line_list);
      std::
      sort<__gnu_cxx::__normal_iterator<_metric_line**,std::vector<_metric_line*,std::allocator<_metric_line*>>>,bool(*)(_metric_line*,_metric_line*)>
                ((__normal_iterator<_metric_line_**,_std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>_>
                  )__first_00._M_current,
                 (__normal_iterator<_metric_line_**,_std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>_>
                  )__last_00._M_current,MetricLineIsLower);
    }
  }
  return dir_met._7_1_;
}

Assistant:

bool ithipublisher::CollectMetricFiles()
{
    char dir_met_name[512];
    bool ret = snprintf(dir_met_name, sizeof(dir_met_name), "%s%sM%d%s", ithi_folder, ITHI_FILE_PATH_SEP, metric_id, ITHI_FILE_PATH_SEP) > 0;

    if (ret)
    {
        DIR *dir_met;

        dir_met = opendir(dir_met_name);
        if (dir_met == NULL)
        {
            ret = false;
        }
        else
        {
            struct dirent *file_ent;

            while (ret && (file_ent = readdir(dir_met)) != NULL)
            {
                MetricFileHolder met_file;

                if (ParseFileName(&met_file, file_ent->d_name, metric_id))
                {
                    /* Check whether this is the latest in list for the month */
                    bool found_already = false;

                    for (size_t i = 0; i < file_list.size(); i++)
                    {
                        if (file_list[i]->year == met_file.year &&
                            file_list[i]->month == met_file.month)
                        {
                            if (met_file.day >= file_list[i]->day)
                            {
                                *(file_list[i]) = met_file;
                            }
                            found_already = true;
                            break;
                        }
                    }

                    if (!found_already)
                    {
                        MetricFileHolder * pmfh = new MetricFileHolder();

                        if (pmfh == NULL)
                        {
                            ret = false;
                        }
                        else
                        {
                            *pmfh = met_file;
                            file_list.push_back(pmfh);
                        }
                    }
                }
            }

            closedir(dir_met);

            ret = file_list.size() > 0;
        }
    }

    if (ret)
    {
        /* Sort the file list from earlier to last */
        std::sort(file_list.begin(), file_list.end(), ithipublisher::MetricFileIsEarlier);

        /* Compute the first and last year and months */
        size_t last_index = file_list.size() - 1;
        last_year = file_list[last_index]->year;
        last_month = file_list[last_index]->month;
        last_day = file_list[last_index]->day;
        first_year = file_list[0]->year;
        first_month = file_list[0]->month;

        nb_months = 1 + last_month - first_month + 12 * (last_year - first_year);

        /* Load the selected data */
        for (size_t i = 0; ret &&  i < file_list.size(); i++)
        {
            ret = LoadFileData((int)i, dir_met_name);
        }

        if (ret)
        {
            std::sort(line_list.begin(), line_list.end(), MetricLineIsLower);
        }
    }

    return ret;
}